

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  bool bVar1;
  undefined4 in_EDX;
  byte *in_RSI;
  undefined1 unaff_retaddr;
  bool is_open;
  int unaff_retaddr_00;
  ImGuiViewport *viewport;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003fc;
  bool *in_stack_00000400;
  char *in_stack_00000408;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  ImVec2 local_50;
  ImVec2 in_stack_ffffffffffffffb8;
  float popup_flags;
  ImGuiID in_stack_ffffffffffffffc0;
  ImGuiContext *pIVar2;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  popup_flags = in_stack_ffffffffffffffb8.y;
  pIVar2 = GImGui;
  ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),&GImGui->Initialized,
                     (char *)GImGui->CurrentWindow);
  bVar1 = IsPopupOpen(in_stack_ffffffffffffffc0,(ImGuiPopupFlags)popup_flags);
  if (bVar1) {
    if (((pIVar2->NextWindowData).Flags & 1U) == 0) {
      GetMainViewport();
      ImGuiViewport::GetCenter
                ((ImGuiViewport *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      ImVec2::ImVec2(&local_50,0.5,0.5);
      SetNextWindowPos((ImVec2 *)&stack0xffffffffffffffb8,4,&local_50);
    }
    local_1 = Begin(in_stack_00000408,in_stack_00000400,in_stack_000003fc);
    if ((!local_1) || ((in_RSI != (byte *)0x0 && ((*in_RSI & 1) == 0)))) {
      EndPopup();
      if ((local_1 & 1U) != 0) {
        ClosePopupToLevel(unaff_retaddr_00,(bool)unaff_retaddr);
      }
      local_1 = false;
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&pIVar2->NextWindowData);
    if ((in_RSI != (byte *)0x0) && ((*in_RSI & 1) != 0)) {
      *in_RSI = 0;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        if (p_open && *p_open)
            *p_open = false;
        return false;
    }

    // Center modal windows by default for increased visibility
    // (this won't really last as settings will kick in, and is mostly for backward compatibility. user may do the same themselves)
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if ((g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasPos) == 0)
    {
        const ImGuiViewport* viewport = GetMainViewport();
        SetNextWindowPos(viewport->GetCenter(), ImGuiCond_FirstUseEver, ImVec2(0.5f, 0.5f));
    }

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse;
    const bool is_open = Begin(name, p_open, flags);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopupToLevel(g.BeginPopupStack.Size, true);
        return false;
    }
    return is_open;
}